

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O2

void jpeg_default_qtables(j_compress_ptr cinfo,boolean force_baseline)

{
  jpeg_add_quant_table(cinfo,0,std_luminance_quant_tbl,cinfo->q_scale_factor[0],force_baseline);
  jpeg_add_quant_table(cinfo,1,std_chrominance_quant_tbl,cinfo->q_scale_factor[1],force_baseline);
  return;
}

Assistant:

GLOBAL(void)
jpeg_default_qtables (j_compress_ptr cinfo, boolean force_baseline)
/* Set or change the 'quality' (quantization) setting, using default tables
 * and straight percentage-scaling quality scales.
 * This entry point allows different scalings for luminance and chrominance.
 */
{
  /* Set up two quantization tables using the specified scaling */
  jpeg_add_quant_table(cinfo, 0, std_luminance_quant_tbl,
		       cinfo->q_scale_factor[0], force_baseline);
  jpeg_add_quant_table(cinfo, 1, std_chrominance_quant_tbl,
		       cinfo->q_scale_factor[1], force_baseline);
}